

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

String * __thiscall
Diligent::GetTextureDescString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,TextureDesc *Desc)

{
  bool bVar1;
  Char *pCVar2;
  TextureFormatAttribs *pTVar3;
  char *in_RCX;
  Uint32 CpuAccessFlags;
  String local_138;
  String local_118;
  String local_f8;
  String local_d8;
  char *local_b8;
  char *FmtName;
  String local_90;
  String local_70;
  String local_50;
  allocator local_1a;
  undefined1 local_19;
  TextureDesc *local_18;
  TextureDesc *Desc_local;
  String *Str;
  
  local_19 = 0;
  local_18 = (TextureDesc *)this;
  Desc_local = (TextureDesc *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"Type: ",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  pCVar2 = GetResourceDimString(local_18->Type);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pCVar2);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"; size: ");
  ToString<unsigned_int>(&local_50,local_18->Width);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = TextureDesc::Is2D(local_18);
  if ((bVar1) || (bVar1 = TextureDesc::Is3D(local_18), bVar1)) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"x");
    ToString<unsigned_int>(&local_70,local_18->Height);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  bVar1 = TextureDesc::Is3D(local_18);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"x");
    ToString<unsigned_int>(&local_90,(local_18->field_3).ArraySize);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  bVar1 = TextureDesc::IsArray(local_18);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"; Num Slices: ");
    ToString<unsigned_int>((String *)&FmtName,(local_18->field_3).ArraySize);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&FmtName);
    std::__cxx11::string::~string((string *)&FmtName);
  }
  pTVar3 = GetTextureFormatAttribs(local_18->Format);
  local_b8 = pTVar3->Name;
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"; Format: ");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_b8);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"; Mip levels: ");
  ToString<unsigned_int>(&local_d8,local_18->MipLevels);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"; Sample Count: ");
  ToString<unsigned_int>(&local_f8,local_18->SampleCount);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"; Usage: ");
  pCVar2 = GetUsageString(local_18->Usage);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pCVar2);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"; Bind Flags: ");
  GetBindFlagsString_abi_cxx11_(&local_118,(Diligent *)(ulong)local_18->BindFlags,0xcabcb5,in_RCX);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"; CPU access: ");
  GetCPUAccessFlagsString_abi_cxx11_
            (&local_138,(Diligent *)(ulong)local_18->CPUAccessFlags,CpuAccessFlags);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  return __return_storage_ptr__;
}

Assistant:

String GetTextureDescString(const TextureDesc& Desc)
{
    String Str = "Type: ";
    Str += GetResourceDimString(Desc.Type);
    Str += "; size: ";
    Str += ToString(Desc.Width);

    if (Desc.Is2D() || Desc.Is3D())
    {
        Str += "x";
        Str += ToString(Desc.Height);
    }

    if (Desc.Is3D())
    {
        Str += "x";
        Str += ToString(Desc.Depth);
    }

    if (Desc.IsArray())
    {
        Str += "; Num Slices: ";
        Str += ToString(Desc.ArraySize);
    }

    const char* FmtName = GetTextureFormatAttribs(Desc.Format).Name;
    Str += "; Format: ";
    Str += FmtName;

    Str += "; Mip levels: ";
    Str += ToString(Desc.MipLevels);

    Str += "; Sample Count: ";
    Str += ToString(Desc.SampleCount);

    Str += "; Usage: ";
    Str += GetUsageString(Desc.Usage);

    Str += "; Bind Flags: ";
    Str += GetBindFlagsString(Desc.BindFlags);

    Str += "; CPU access: ";
    Str += GetCPUAccessFlagsString(Desc.CPUAccessFlags);

    return Str;
}